

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O3

size_t __thiscall rcg::Buffer::getXPadding(Buffer *this,uint32_t part)

{
  bool bVar1;
  element_type *peVar2;
  BUFFER_HANDLE pvVar3;
  GC_ERROR GVar4;
  void *pvVar5;
  unsigned_long ret;
  size_t size;
  INFO_DATATYPE type;
  size_t local_30 [2];
  INFO_DATATYPE local_1c;
  
  bVar1 = this->multipart;
  pvVar5 = Stream::getHandle(this->parent);
  peVar2 = (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pvVar3 = this->buffer;
  if (bVar1 == true) {
    local_30[0] = 0;
    local_30[1] = 8;
    if (pvVar3 != (BUFFER_HANDLE)0x0 && pvVar5 != (void *)0x0) {
      (*peVar2->DSGetBufferPartInfo)(pvVar5,pvVar3,part,9,&local_1c,local_30,local_30 + 1);
      return local_30[0];
    }
  }
  else {
    local_30[0] = 0;
    local_30[1] = 8;
    if ((pvVar3 != (BUFFER_HANDLE)0x0 && pvVar5 != (void *)0x0) &&
       (GVar4 = (*peVar2->DSGetBufferInfo)(pvVar5,pvVar3,0xe,&local_1c,local_30,local_30 + 1),
       GVar4 == 0)) {
      return local_30[0];
    }
  }
  return 0;
}

Assistant:

size_t Buffer::getXPadding(uint32_t part) const
{
  if (multipart)
  {
    return getBufferPartValue<size_t>(gentl, parent->getHandle(), buffer, part,
                                      GenTL::BUFFER_PART_INFO_XPADDING);
  }
  else
  {
    return getBufferValue<size_t>(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_XPADDING);
  }
}